

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O0

void __thiscall
xs::PosixTestProcess::start
          (PosixTestProcess *this,char *name,char *params,char *workingDir,char *caseList)

{
  deBool dVar1;
  size_t sVar2;
  Error *this_00;
  char *pcVar3;
  TestProcessException *pTVar4;
  size_t sVar5;
  Process *pPVar6;
  deUint64 dVar7;
  deFile *pdVar8;
  bool bVar9;
  char *local_368;
  char *local_320;
  allocator<char> local_2c9;
  string local_2c8;
  deFile *local_2a8;
  deFile *dst;
  ProcessError *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  allocator<char> local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  allocator<char> local_1bb;
  byte local_1ba;
  byte local_1b9;
  FilePath local_1b8;
  byte local_191;
  FilePath local_190;
  FilePath local_170;
  FilePath local_150;
  string local_130 [8];
  string cmdLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  FilePath local_a8;
  FilePath local_88;
  undefined1 local_68 [8];
  FilePath logFilePath;
  bool hasCaseList;
  char *caseList_local;
  char *workingDir_local;
  char *params_local;
  char *name_local;
  PosixTestProcess *this_local;
  
  sVar2 = strlen(caseList);
  do {
    dVar1 = deGetFalse();
    bVar9 = false;
    if (dVar1 == 0) {
      bVar9 = this->m_process == (Process *)0x0;
    }
    if (!bVar9) {
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,(char *)0x0,"!m_process",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsPosixTestProcess.cpp"
                   ,0xbe);
      __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  de::FilePath::FilePath(&local_88,workingDir);
  de::FilePath::FilePath(&local_a8,"TestResults.qpa");
  de::FilePath::join((FilePath *)local_68,&local_88,&local_a8);
  de::FilePath::~FilePath(&local_a8);
  de::FilePath::~FilePath(&local_88);
  pcVar3 = de::FilePath::getPath((FilePath *)local_68);
  std::__cxx11::string::operator=((string *)&this->m_logFileName,pcVar3);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  dVar1 = deFileExists(pcVar3);
  if (dVar1 != 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    dVar1 = deDeleteFile(pcVar3);
    if (dVar1 != 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      dVar1 = deFileExists(pcVar3);
      if (dVar1 == 0) goto LAB_0012d237;
    }
    cmdLine.field_2._M_local_buf[0xe] = '\x01';
    pTVar4 = (TestProcessException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"Failed to remove \'",
               (allocator<char> *)(cmdLine.field_2._M_local_buf + 0xf));
    std::operator+(&local_e8,&local_108,&this->m_logFileName);
    std::operator+(&local_c8,&local_e8,"\'");
    TestProcessException::TestProcessException(pTVar4,&local_c8);
    cmdLine.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(pTVar4,&TestProcessException::typeinfo,TestProcessException::~TestProcessException);
  }
LAB_0012d237:
  local_191 = 0;
  local_1b9 = 0;
  local_1ba = 0;
  de::FilePath::FilePath(&local_150,name);
  bVar9 = de::FilePath::isAbsolutePath(&local_150);
  local_320 = name;
  if (!bVar9) {
    de::FilePath::FilePath(&local_190,workingDir);
    local_191 = 1;
    de::FilePath::FilePath(&local_1b8,name);
    local_1b9 = 1;
    de::FilePath::join(&local_170,&local_190,&local_1b8);
    local_1ba = 1;
    local_320 = de::FilePath::getPath(&local_170);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_130,local_320,&local_1bb);
  std::allocator<char>::~allocator(&local_1bb);
  if ((local_1ba & 1) != 0) {
    de::FilePath::~FilePath(&local_170);
  }
  if ((local_1b9 & 1) != 0) {
    de::FilePath::~FilePath(&local_1b8);
  }
  if ((local_191 & 1) != 0) {
    de::FilePath::~FilePath(&local_190);
  }
  de::FilePath::~FilePath(&local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200," --deqp-log-filename=",&local_201);
  de::FilePath::getBaseName_abi_cxx11_(&local_228,(FilePath *)local_68);
  std::operator+(&local_1e0,&local_200,&local_228);
  std::__cxx11::string::operator+=(local_130,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  if (sVar2 != 0) {
    std::__cxx11::string::operator+=(local_130," --deqp-stdin-caselist");
  }
  sVar5 = strlen(params);
  if (sVar5 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268," ",(allocator<char> *)((long)&e + 7));
    std::operator+(&local_248,&local_268,params);
    std::__cxx11::string::operator+=(local_130,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  }
  pPVar6 = (Process *)operator_new(8);
  de::Process::Process(pPVar6);
  this->m_process = pPVar6;
  pPVar6 = this->m_process;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  sVar5 = strlen(workingDir);
  local_368 = workingDir;
  if (sVar5 == 0) {
    local_368 = (char *)0x0;
  }
  de::Process::start(pPVar6,pcVar3,local_368);
  dVar7 = deGetMicroseconds();
  this->m_processStartTime = dVar7;
  pdVar8 = de::Process::getStdOut(this->m_process);
  if (pdVar8 != (deFile *)0x0) {
    pdVar8 = de::Process::getStdOut(this->m_process);
    posix::PipeReader::start(&this->m_stdOutReader,pdVar8);
  }
  pdVar8 = de::Process::getStdErr(this->m_process);
  if (pdVar8 != (deFile *)0x0) {
    pdVar8 = de::Process::getStdErr(this->m_process);
    posix::PipeReader::start(&this->m_stdErrReader,pdVar8);
  }
  if (sVar2 != 0) {
    local_2a8 = de::Process::getStdIn(this->m_process);
    if (local_2a8 == (deFile *)0x0) {
      (*(this->super_TestProcess)._vptr_TestProcess[4])();
      pTVar4 = (TestProcessException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2c8,"Failed to write case list",&local_2c9);
      TestProcessException::TestProcessException(pTVar4,&local_2c8);
      __cxa_throw(pTVar4,&TestProcessException::typeinfo,TestProcessException::~TestProcessException
                 );
    }
    posix::CaseListWriter::start(&this->m_caseListWriter,caseList,local_2a8);
  }
  std::__cxx11::string::~string(local_130);
  de::FilePath::~FilePath((FilePath *)local_68);
  return;
}

Assistant:

void PosixTestProcess::start (const char* name, const char* params, const char* workingDir, const char* caseList)
{
	bool hasCaseList = strlen(caseList) > 0;

	XS_CHECK(!m_process);

	de::FilePath logFilePath = de::FilePath::join(workingDir, "TestResults.qpa");
	m_logFileName = logFilePath.getPath();

	// Remove old file if such exists.
	if (deFileExists(m_logFileName.c_str()))
	{
		if (!deDeleteFile(m_logFileName.c_str()) || deFileExists(m_logFileName.c_str()))
			throw TestProcessException(string("Failed to remove '") + m_logFileName + "'");
	}

	// Construct command line.
	string cmdLine = de::FilePath(name).isAbsolutePath() ? name : de::FilePath::join(workingDir, name).getPath();
	cmdLine += string(" --deqp-log-filename=") + logFilePath.getBaseName();

	if (hasCaseList)
		cmdLine += " --deqp-stdin-caselist";

	if (strlen(params) > 0)
		cmdLine += string(" ") + params;

	DE_ASSERT(!m_process);
	m_process = new de::Process();

	try
	{
		m_process->start(cmdLine.c_str(), strlen(workingDir) > 0 ? workingDir : DE_NULL);
	}
	catch (const de::ProcessError& e)
	{
		delete m_process;
		m_process = DE_NULL;
		throw TestProcessException(e.what());
	}

	m_processStartTime = deGetMicroseconds();

	// Create stdout & stderr readers.
	if (m_process->getStdOut())
		m_stdOutReader.start(m_process->getStdOut());

	if (m_process->getStdErr())
		m_stdErrReader.start(m_process->getStdErr());

	// Start case list writer.
	if (hasCaseList)
	{
		deFile* dst = m_process->getStdIn();
		if (dst)
			m_caseListWriter.start(caseList, dst);
		else
		{
			cleanup();
			throw TestProcessException("Failed to write case list");
		}
	}
}